

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastBmS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte *p;
  byte bVar1;
  int iVar2;
  uint uVar3;
  ushort *puVar4;
  char *pcVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_00;
  size_t size_1;
  ulong uVar6;
  size_t size;
  char *pcVar7;
  char *ptr_00;
  uint *puVar8;
  pair<const_char_*,_int> pVar9;
  string_view data_00;
  string_view data_01;
  
  if (data.field_0._0_2_ != 0) {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this.data = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((this.data & 7) != 0) {
    AlignFail(this.data);
  }
  p = (byte *)(ptr + 2);
  uVar6 = (ulong)data.field_0 >> 0x10;
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  bVar1 = *p;
  pcVar5 = (char *)(ulong)bVar1;
  uVar3 = (uint)bVar1;
  if (arena.data == 0) {
    if ((char)bVar1 < '\0') {
      pVar9 = ReadSizeFallback((char *)p,(uint)bVar1);
      ptr_00 = pVar9.first;
      uVar3 = pVar9.second;
    }
    else {
      ptr_00 = ptr + 3;
      pcVar5 = ptr;
    }
    if (ptr_00 == (char *)0x0) goto LAB_0021bfb5;
    iVar2 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,ptr_00);
    if ((int)uVar3 <= iVar2) {
      pcVar7 = (char *)(long)(int)uVar3;
      arena.data = 0;
      data_01._M_str = ptr_00;
      data_01._M_len = (size_t)pcVar7;
      pcVar5 = pcVar7;
      MicroString::SetImpl((MicroString *)this,data_01,(Arena *)0x0,7);
      puVar4 = (ushort *)(ptr_00 + (long)pcVar7);
      ctx_00 = extraout_RDX_01;
      goto LAB_0021bfdf;
    }
    arena.data = 0;
  }
  else {
    if ((char)bVar1 < '\0') {
      pVar9 = ReadSizeFallback((char *)p,(uint)bVar1);
      ptr_00 = pVar9.first;
      uVar3 = pVar9.second;
    }
    else {
      ptr_00 = ptr + 3;
      pcVar5 = ptr;
    }
    if (ptr_00 == (char *)0x0) {
LAB_0021bfb5:
      puVar4 = (ushort *)0x0;
      arena = data.field_0;
      ctx_00 = ctx;
      goto LAB_0021bfdf;
    }
    iVar2 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,ptr_00);
    if ((int)uVar3 <= iVar2) {
      pcVar7 = (char *)(long)(int)uVar3;
      data_00._M_str = ptr_00;
      data_00._M_len = (size_t)pcVar7;
      pcVar5 = pcVar7;
      MicroString::SetImpl((MicroString *)this,data_00,(Arena *)arena,7);
      puVar4 = (ushort *)(ptr_00 + (long)pcVar7);
      ctx_00 = extraout_RDX;
      goto LAB_0021bfdf;
    }
  }
  puVar4 = (ushort *)
           EpsCopyInputStream::ReadMicroStringFallback
                     (&ctx->super_EpsCopyInputStream,ptr_00,uVar3,(MicroString *)this,(Arena *)arena
                     );
  arena = this;
  ctx_00 = extraout_RDX_00;
  pcVar5 = ptr_00;
LAB_0021bfdf:
  uVar6 = hasbits | 1L << (uVar6 & 0x3f);
  if (puVar4 == (ushort *)0x0) {
    pcVar5 = Error(msg,pcVar5,ctx_00,(TcFieldData)arena,table,uVar6);
    return pcVar5;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar8 & 3) != 0) {
        AlignFail(puVar8);
      }
      *puVar8 = *puVar8 | (uint)uVar6;
    }
    return (char *)puVar4;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar4;
  if ((uVar3 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar6 = (ulong)(uVar3 & 0xfffffff8);
  pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                             (msg,puVar4,ctx,
                              (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2));
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBmS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, MicroString, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}